

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::read_pixels_format_mismatch
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 *pixels;
  undefined8 *pixels_00;
  value_type_conflict5 *__val;
  value_type_conflict3 *__val_1;
  GLint readType;
  GLint readFormat;
  string local_40;
  
  pixels = (undefined4 *)operator_new(4);
  *pixels = 0;
  pixels_00 = (undefined8 *)operator_new(8);
  *pixels_00 = 0;
  readFormat = 0x1234;
  readType = 0x1234;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Unsupported combinations of format and type will generate an GL_INVALID_OPERATION error."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1908,0x8363,pixels_00);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1906,0x8363,pixels_00);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1907,0x8033,pixels_00);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1906,0x8033,pixels_00);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1907,0x8034,pixels_00);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1906,0x8034,pixels_00);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_RGBA/GL_UNSIGNED_BYTE is always accepted and the other acceptable pair can be discovered by querying GL_IMPLEMENTATION_COLOR_READ_FORMAT and GL_IMPLEMENTATION_COLOR_READ_TYPE."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,0x1908,0x1401,pixels);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8b9b,&readFormat);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8b9a,&readType);
  glu::CallLogWrapper::glReadPixels(&ctx->super_CallLogWrapper,0,0,1,1,readFormat,readType,pixels);
  NegativeTestContext::expectError(ctx,0);
  NegativeTestContext::endSection(ctx);
  operator_delete(pixels_00,8);
  operator_delete(pixels,4);
  return;
}

Assistant:

void read_pixels_format_mismatch (NegativeTestContext& ctx)
{
	std::vector<GLubyte>	ubyteData	(4);
	std::vector<GLushort>	ushortData	(4);
	GLint					readFormat	= 0x1234;
	GLint					readType	= 0x1234;

	ctx.beginSection("Unsupported combinations of format and type will generate an GL_INVALID_OPERATION error.");
	ctx.glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_SHORT_5_6_5, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_5_6_5, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_RGB, GL_UNSIGNED_SHORT_4_4_4_4, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_4_4_4_4, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_RGB, GL_UNSIGNED_SHORT_5_5_5_1, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glReadPixels(0, 0, 1, 1, GL_ALPHA, GL_UNSIGNED_SHORT_5_5_5_1, &ushortData[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_RGBA/GL_UNSIGNED_BYTE is always accepted and the other acceptable pair can be discovered by querying GL_IMPLEMENTATION_COLOR_READ_FORMAT and GL_IMPLEMENTATION_COLOR_READ_TYPE.");
	ctx.glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &ubyteData[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_FORMAT, &readFormat);
	ctx.glGetIntegerv(GL_IMPLEMENTATION_COLOR_READ_TYPE, &readType);
	ctx.glReadPixels(0, 0, 1, 1, readFormat, readType, &ubyteData[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();
}